

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putcontig8bitYCbCr41tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  uint32_t local_8c;
  uint32_t local_88;
  uint32_t b_6;
  uint32_t g_6;
  uint32_t r_6;
  uint32_t b_5;
  uint32_t g_5;
  uint32_t r_5;
  uint32_t b_4;
  uint32_t g_4;
  uint32_t r_4;
  int32_t Cr_1;
  int32_t Cb_1;
  uint32_t b_3;
  uint32_t g_3;
  uint32_t r_3;
  uint32_t b_2;
  uint32_t g_2;
  uint32_t r_2;
  uint32_t b_1;
  uint32_t g_1;
  uint32_t r_1;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  int32_t Cr;
  int32_t Cb;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  Cr = h;
  Cb = w;
  h_local = y;
  _y_local = cp;
  cp_local = (uint32_t *)img;
  do {
    for (w_local = (uint)Cb >> 2; w_local != 0; w_local = w_local - 1) {
      r = (uint32_t)pp[4];
      g = (uint32_t)pp[5];
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)*pp,r,g,&b,&r_1,&g_1);
      *_y_local = b | r_1 << 8 | g_1 << 0x10 | 0xff000000;
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)pp[1],r,g,&b_1,&r_2,&g_2);
      _y_local[1] = b_1 | r_2 << 8 | g_2 << 0x10 | 0xff000000;
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)pp[2],r,g,&b_2,&r_3,&g_3);
      _y_local[2] = b_2 | r_3 << 8 | g_3 << 0x10 | 0xff000000;
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)pp[3],r,g,&b_3,(uint32_t *)&Cb_1,
                     (uint32_t *)&Cr_1);
      _y_local[3] = b_3 | Cb_1 << 8 | Cr_1 << 0x10 | 0xff000000;
      _y_local = _y_local + 4;
      pp = pp + 6;
    }
    if ((Cb & 3U) != 0) {
      r_4 = (uint32_t)pp[4];
      g_4 = (uint32_t)pp[5];
      switch(Cb & 3) {
      case 3:
        TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)pp[2],r_4,g_4,&b_4,&r_5,&g_5);
        _y_local[2] = b_4 | r_5 << 8 | g_5 << 0x10 | 0xff000000;
      case 2:
        TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)pp[1],r_4,g_4,&b_5,&r_6,&g_6);
        _y_local[1] = b_5 | r_6 << 8 | g_6 << 0x10 | 0xff000000;
      case 1:
        TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)*pp,r_4,g_4,&b_6,&local_88,
                       &local_8c);
        *_y_local = b_6 | local_88 << 8 | local_8c << 0x10 | 0xff000000;
      default:
        _y_local = _y_local + (Cb & 3);
        pp = pp + 6;
      }
    }
    _y_local = _y_local + toskew;
    pp = pp + (fromskew / 4) * 6;
    Cr = Cr + -1;
  } while (Cr != 0);
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitYCbCr41tile)
{
    (void)y;
    fromskew = (fromskew / 4) * (4 * 1 + 2);
    do
    {
        x = w >> 2;
        while (x > 0)
        {
            int32_t Cb = pp[4];
            int32_t Cr = pp[5];

            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp[1], pp[1]);
            YCbCrtoRGB(cp[2], pp[2]);
            YCbCrtoRGB(cp[3], pp[3]);

            cp += 4;
            pp += 6;
            x--;
        }

        if ((w & 3) != 0)
        {
            int32_t Cb = pp[4];
            int32_t Cr = pp[5];

            switch ((w & 3))
            {
                case 3:
                    YCbCrtoRGB(cp[2], pp[2]); /*-fallthrough*/
                case 2:
                    YCbCrtoRGB(cp[1], pp[1]); /*-fallthrough*/
                case 1:
                    YCbCrtoRGB(cp[0], pp[0]); /*-fallthrough*/
                case 0:
                    break;
            }

            cp += (w & 3);
            pp += 6;
        }

        cp += toskew;
        pp += fromskew;
    } while (--h);
}